

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

ImportCacheValue * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::importData
          (Interpreter *this,LocationRange *loc,LiteralString *file)

{
  JsonnetImportCallback *pJVar1;
  void *pvVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  mapped_type *ppIVar6;
  mapped_type pIVar7;
  long *plVar8;
  RuntimeError *__return_storage_ptr__;
  size_type *psVar9;
  UString *__y;
  string input;
  char *buf;
  string msg;
  size_t buflen;
  char *found_here_cptr;
  string dir;
  string epath;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  key;
  string local_130;
  char *local_110;
  UString local_108;
  size_t local_e8;
  char *local_e0;
  LocationRange *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_70;
  
  path_dir_with_trailing_separator(&local_b0,&loc->file);
  __y = &file->value;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_70,&local_b0,__y);
  ppIVar6 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
            ::operator[](&this->cachedImports,&local_70);
  _Var4._M_p = local_b0._M_dataplus._M_p;
  pIVar7 = *ppIVar6;
  if (pIVar7 == (mapped_type)0x0) {
    local_110 = (char *)0x0;
    local_e8 = 0;
    pJVar1 = this->importCallback;
    pvVar2 = this->importCallbackContext;
    local_d8 = loc;
    encode_utf8(&local_130,__y);
    iVar5 = (*pJVar1)(pvVar2,_Var4._M_p,local_130._M_dataplus._M_p,&local_e0,&local_110,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,local_110,local_110 + local_e8);
    free(local_110);
    if (iVar5 == 1) {
      jsonnet_string_escape(&local_108,__y,false);
      encode_utf8(&local_90,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity * 4 + 4);
      }
      std::operator+(&local_d0,"couldn\'t open import \"",&local_90);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_108._M_dataplus._M_p = (pointer)*plVar8;
      psVar9 = (size_type *)(plVar8 + 2);
      if (local_108._M_dataplus._M_p == (pointer)psVar9) {
        local_108.field_2._M_allocated_capacity = *psVar9;
        local_108.field_2._8_8_ = plVar8[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar9;
      }
      local_108._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_130._M_dataplus._M_p);
      __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
      Stack::makeError(__return_storage_ptr__,&this->stack,local_d8,(string *)&local_108);
      __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    pIVar7 = (mapped_type)operator_new(0x48);
    pcVar3 = local_e0;
    (pIVar7->foundHere)._M_dataplus._M_p = (pointer)0x0;
    (pIVar7->foundHere)._M_string_length = 0;
    (pIVar7->foundHere).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pIVar7->foundHere).field_2 + 8) = 0;
    (pIVar7->content)._M_dataplus._M_p = (pointer)0x0;
    (pIVar7->content)._M_string_length = 0;
    (pIVar7->content).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pIVar7->content).field_2 + 8) = 0;
    pIVar7->thunk = (HeapThunk *)0x0;
    (pIVar7->foundHere)._M_dataplus._M_p = (pointer)&(pIVar7->foundHere).field_2;
    (pIVar7->foundHere)._M_string_length = 0;
    (pIVar7->foundHere).field_2._M_local_buf[0] = '\0';
    (pIVar7->content)._M_dataplus._M_p = (pointer)&(pIVar7->content).field_2;
    (pIVar7->content)._M_string_length = 0;
    (pIVar7->content).field_2._M_local_buf[0] = '\0';
    strlen(local_e0);
    std::__cxx11::string::_M_replace((ulong)pIVar7,0,(char *)0x0,(ulong)pcVar3);
    std::__cxx11::string::_M_assign((string *)&pIVar7->content);
    pIVar7->thunk = (HeapThunk *)0x0;
    free(local_e0);
    ppIVar6 = std::
              map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
              ::operator[](&this->cachedImports,&local_70);
    *ppIVar6 = pIVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
    operator_delete(local_70.second._M_dataplus._M_p,
                    local_70.second.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return pIVar7;
}

Assistant:

ImportCacheValue *importData(const LocationRange &loc, const LiteralString *file)
    {
        // `dir` is passed to the importCallback, which may be externally defined.
        // For backwards compatibility, we need to keep the trailing directory separator.
        // For example, the default callback in libjsonnet.cpp joins paths with simple
        // string concatenation. Other (external) implementations might do the same.
        std::string dir = path_dir_with_trailing_separator(loc.file);

        const UString &path = file->value;

        std::pair<std::string, UString> key(dir, path);
        ImportCacheValue *cached_value = cachedImports[key];
        if (cached_value != nullptr)
            return cached_value;

        char *found_here_cptr;
        char *buf = NULL;
        size_t buflen = 0;
        int result = importCallback(importCallbackContext,
                                    dir.c_str(),
                                    encode_utf8(path).c_str(),
                                    &found_here_cptr,
                                    &buf,
                                    &buflen);

        std::string input(buf, buflen);
        ::free(buf);

        if (result == 1) {  // failure
            std::string epath = encode_utf8(jsonnet_string_escape(path, false));
            std::string msg = "couldn't open import \"" + epath + "\": ";
            msg += input;
            throw makeError(loc, msg);
        }

        auto *input_ptr = new ImportCacheValue();
        input_ptr->foundHere = found_here_cptr;
        input_ptr->content = input;
        input_ptr->thunk = nullptr;  // May be filled in later by import().
        ::free(found_here_cptr);
        cachedImports[key] = input_ptr;
        return input_ptr;
    }